

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

int32 fe_compute_melcosine(melfb_t *mel_fb)

{
  int iVar1;
  mfcc_t **ppmVar2;
  mfcc_t *pmVar3;
  double dVar4;
  float64 cosine;
  int32 j;
  int32 i;
  float64 freqstep;
  melfb_t *mel_fb_local;
  
  ppmVar2 = (mfcc_t **)
            __ckd_calloc_2d__((long)mel_fb->num_cepstra,(long)mel_fb->num_filters,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                              ,0x2b7);
  mel_fb->mel_cosine = ppmVar2;
  iVar1 = mel_fb->num_filters;
  for (cosine._4_4_ = 0; cosine._4_4_ < mel_fb->num_cepstra; cosine._4_4_ = cosine._4_4_ + 1) {
    for (cosine._0_4_ = 0; cosine._0_4_ < mel_fb->num_filters; cosine._0_4_ = cosine._0_4_ + 1) {
      dVar4 = cos((3.141592653589793 / (double)iVar1) * (double)cosine._4_4_ *
                  ((double)cosine._0_4_ + 0.5));
      mel_fb->mel_cosine[cosine._4_4_][cosine._0_4_] = (mfcc_t)(float)dVar4;
    }
  }
  dVar4 = sqrt(1.0 / (double)mel_fb->num_filters);
  mel_fb->sqrt_inv_n = (mfcc_t)(float)dVar4;
  dVar4 = sqrt(2.0 / (double)mel_fb->num_filters);
  mel_fb->sqrt_inv_2n = (mfcc_t)(float)dVar4;
  if (mel_fb->lifter_val != 0) {
    pmVar3 = (mfcc_t *)calloc((long)mel_fb->num_cepstra,4);
    mel_fb->lifter = pmVar3;
    for (cosine._4_4_ = 0; cosine._4_4_ < mel_fb->num_cepstra; cosine._4_4_ = cosine._4_4_ + 1) {
      iVar1 = mel_fb->lifter_val;
      dVar4 = sin(((double)cosine._4_4_ * 3.141592653589793) / (double)mel_fb->lifter_val);
      mel_fb->lifter[cosine._4_4_] = (mfcc_t)(float)((double)(iVar1 / 2) * dVar4 + 1.0);
    }
  }
  return 0;
}

Assistant:

int32
fe_compute_melcosine(melfb_t * mel_fb)
{

    float64 freqstep;
    int32 i, j;

    mel_fb->mel_cosine =
        (mfcc_t **) ckd_calloc_2d(mel_fb->num_cepstra,
                                  mel_fb->num_filters, sizeof(mfcc_t));

    freqstep = M_PI / mel_fb->num_filters;
    /* NOTE: The first row vector is actually unnecessary but we leave
     * it in to avoid confusion. */
    for (i = 0; i < mel_fb->num_cepstra; i++) {
        for (j = 0; j < mel_fb->num_filters; j++) {
            float64 cosine;

            cosine = cos(freqstep * i * (j + 0.5));
            mel_fb->mel_cosine[i][j] = FLOAT2COS(cosine);
        }
    }

    /* Also precompute normalization constants for unitary DCT. */
    mel_fb->sqrt_inv_n = FLOAT2COS(sqrt(1.0 / mel_fb->num_filters));
    mel_fb->sqrt_inv_2n = FLOAT2COS(sqrt(2.0 / mel_fb->num_filters));

    /* And liftering weights */
    if (mel_fb->lifter_val) {
        mel_fb->lifter =
            calloc(mel_fb->num_cepstra, sizeof(*mel_fb->lifter));
        for (i = 0; i < mel_fb->num_cepstra; ++i) {
            mel_fb->lifter[i] = FLOAT2MFCC(1 + mel_fb->lifter_val / 2
                                           * sin(i * M_PI /
                                                 mel_fb->lifter_val));
        }
    }

    return (0);
}